

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osThread.cpp
# Opt level: O2

void osThread::Sleep(unsigned_long ms,char *file,int line)

{
  osThread *poVar1;
  
  poVar1 = GetCurrent();
  if (poVar1 != (osThread *)0x0) {
    poVar1->Filename = file;
    poVar1->Linenumber = line;
    poVar1->USleepTime = ms * 1000;
    usleep((__useconds_t)(ms * 1000));
    poVar1->USleepTime = 0;
    return;
  }
  usleep((int)ms * 1000);
  return;
}

Assistant:

void osThread::Sleep(unsigned long ms, const char* file, int line)
{
    osThread* thread = GetCurrent();

    if (thread != nullptr)
    {
        thread->Filename = file;
        thread->Linenumber = line;

        thread->USleepTime = ms * 1000;
#ifdef _WIN32
        SleepEx(ms, true);
#elif __linux__
        usleep(ms * 1000);
#endif
        thread->USleepTime = 0;
    }
    else
    {
#ifdef _WIN32
        SleepEx(ms, true);
#elif __linux__
        usleep(ms * 1000);
#endif
    }
}